

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O2

int64_t SUNHashMap_GetValue(SUNHashMap map,char *key,void **value)

{
  int iVar1;
  int64_t iVar2;
  long lVar3;
  SUNStlVector_SUNHashMapKeyValue pSVar4;
  int64_t iVar5;
  
  if (value == (void **)0x0 || (key == (char *)0x0 || map == (SUNHashMap)0x0)) {
    return -99;
  }
  iVar2 = sunHashMapIdxFromKey(map,key);
  pSVar4 = map->buckets;
  if (pSVar4->values[iVar2] != (SUNHashMapKeyValue)0x0) {
    lVar3 = pSVar4->size;
    iVar1 = strcmp(pSVar4->values[iVar2]->key,key);
    if (iVar1 == 0) goto LAB_0010a806;
  }
  iVar2 = SUNHashMap_Iterate(map,iVar2 + 1,sunHashMapLinearProbeGet,key);
  if (iVar2 == -99) {
    return -99;
  }
  pSVar4 = map->buckets;
  lVar3 = pSVar4->size;
LAB_0010a806:
  iVar5 = -1;
  if (((-1 < iVar2) && (iVar2 < lVar3)) && (pSVar4->values != (SUNHashMapKeyValue *)0x0)) {
    *value = pSVar4->values[iVar2]->value;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int64_t SUNHashMap_GetValue(SUNHashMap map, const char* key, void** value)
{
  int64_t idx;
  int64_t retval;
  sunbooleantype collision;

  if (map == NULL || key == NULL || value == NULL) { return SUNHASHMAP_ERROR; }

  idx = sunHashMapIdxFromKey(map, key);

  SUNHashMapKeyValue kvp = *SUNStlVector_SUNHashMapKeyValue_At(map->buckets, idx);

  /* Check for a collision (NULL kvp means there was a collision at one point, but
     the colliding key has since been removed)*/
  collision = kvp ? strcmp(kvp->key, key) : SUNTRUE;

  /* Resolve a collision via linear probing */
  if (collision)
  {
    retval = SUNHashMap_Iterate(map, idx + 1, sunHashMapLinearProbeGet, key);
    if (retval == SUNHASHMAP_ERROR)
    {
      /* the key was either not found anywhere or an error occurred */
      return retval;
    }
    else { idx = retval; }
  }

  /* Return a reference to the value only */
  SUNHashMapKeyValue* kvp_ptr = SUNStlVector_SUNHashMapKeyValue_At(map->buckets,
                                                                   idx);
  if (kvp_ptr) { *value = (*kvp_ptr)->value; }
  else { return SUNHASHMAP_KEYNOTFOUND; }

  return (0);
}